

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O1

void DC8uvNoTop_SSE2(uint8_t *dst)

{
  byte bVar1;
  int dc0;
  uint uVar2;
  long lVar3;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 auVar4 [16];
  
  dc0 = 4;
  lVar3 = -1;
  do {
    dc0 = dc0 + (uint)dst[lVar3];
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0xff);
  uVar2 = (uint)dc0 >> 3;
  bVar1 = (byte)((uint)dc0 >> 0x18);
  uVar6 = (undefined1)(uVar2 >> 0x10);
  uVar5 = (undefined1)(uVar2 >> 8);
  auVar4._4_4_ = (int)(CONCAT35(CONCAT21(CONCAT11(bVar1 >> 3,bVar1 >> 3),uVar6),
                                CONCAT14(uVar6,uVar2)) >> 0x20);
  auVar4[3] = uVar5;
  auVar4[2] = uVar5;
  auVar4[0] = (undefined1)uVar2;
  auVar4[1] = auVar4[0];
  auVar4._8_8_ = 0;
  auVar4 = pshuflw(auVar4,auVar4,0);
  lVar3 = 0;
  do {
    *(long *)(dst + lVar3) = auVar4._0_8_;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x100);
  return;
}

Assistant:

static void DC8uvNoTop_SSE2(uint8_t* dst) {  // DC with no top samples
  int dc0 = 4;
  int i;
  for (i = 0; i < 8; ++i) {
    dc0 += dst[-1 + i * BPS];
  }
  Put8x8uv_SSE2(dc0 >> 3, dst);
}